

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_pool.hpp
# Opt level: O0

packet_ptr __thiscall libtorrent::aux::packet_slab::alloc(packet_slab *this)

{
  bool bVar1;
  reference pvVar2;
  int *in_RSI;
  packet_slab *this_local;
  type *ret;
  
  bVar1 = ::std::
          vector<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::allocator<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_>_>
          ::empty((vector<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::allocator<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_>_>
                   *)(in_RSI + 4));
  if (bVar1) {
    create_packet((aux *)this,*in_RSI);
  }
  else {
    pvVar2 = ::std::
             vector<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::allocator<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_>_>
             ::back((vector<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::allocator<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_>_>
                     *)(in_RSI + 4));
    ::std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::unique_ptr
              ((unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)this,pvVar2);
    ::std::
    vector<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::allocator<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_>_>
    ::pop_back((vector<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::allocator<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_>_>
                *)(in_RSI + 4));
  }
  return (__uniq_ptr_data<libtorrent::aux::packet,_libtorrent::aux::packet_deleter,_true,_true>)
         (__uniq_ptr_data<libtorrent::aux::packet,_libtorrent::aux::packet_deleter,_true,_true>)this
  ;
}

Assistant:

packet_ptr alloc()
		{
			if (m_storage.empty()) return create_packet(allocate_size);
			auto ret = std::move(m_storage.back());
#ifdef TORRENT_ADDRESS_SANITIZER
			__asan_unpoison_memory_region(ret.get(), sizeof(packet) + std::size_t(allocate_size));
#endif
			m_storage.pop_back();
			return ret;
		}